

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O3

uint check_for_inscrip_with_int(object *obj,char *inscrip,int *ival)

{
  size_t sVar1;
  char *pcVar2;
  ushort **ppuVar3;
  long lVar4;
  uint uVar5;
  
  sVar1 = strlen(inscrip);
  uVar5 = 0;
  if (obj->note != 0) {
    pcVar2 = quark_str(obj->note);
    uVar5 = 0;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strstr(pcVar2,inscrip);
      if (pcVar2 != (char *)0x0) {
        uVar5 = 0;
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (long)pcVar2[sVar1] * 2 + 1) & 8) != 0) {
            if (uVar5 == 0) {
              lVar4 = strtol(pcVar2 + sVar1,(char **)0x0,10);
              if (0x7ffffffe < lVar4) {
                lVar4 = 0x7fffffff;
              }
              *ival = (int)lVar4;
            }
            uVar5 = uVar5 + 1;
          }
          pcVar2 = strstr(pcVar2 + 1,inscrip);
        } while (pcVar2 != (char *)0x0);
      }
    }
  }
  return uVar5;
}

Assistant:

unsigned check_for_inscrip_with_int(const struct object *obj, const char *inscrip, int* ival)
{
	unsigned i = 0;
	size_t inlen = strlen(inscrip);
	const char *s;

	if (!obj->note) return 0;

	s = quark_str(obj->note);

	/* Needing this implies there are bad instances of obj->note around,
	 * but I haven't been able to track down their origins - NRM */
	if (!s) return 0;

	do {
		s = strstr(s, inscrip);
		if (!s) break;
		if (isdigit(s[inlen])) {
			if (i == 0) {
				long inarg = strtol(s + inlen, 0, 10);

				*ival = (inarg < INT_MAX) ? (int) inarg : INT_MAX;
			}
			i++;
		}
		s++;
	} while (s);

	return i;
}